

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::GetTranspose(Matrix *__return_storage_ptr__,Matrix *this)

{
  Fraction *pFVar1;
  Fraction *pFVar2;
  int local_24;
  int local_20;
  int j;
  int i;
  Matrix *this_local;
  Matrix *result;
  
  Matrix(__return_storage_ptr__,this->m_,this->n_,0);
  for (local_20 = 0; local_20 < this->m_; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < this->n_; local_24 = local_24 + 1) {
      pFVar1 = At(this,local_24,local_20);
      pFVar2 = At(__return_storage_ptr__,local_20,local_24);
      *pFVar2 = *pFVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::GetTranspose() const {
  Matrix result(m_, n_);
  for (int i = 0; i < m_; ++i) {
    for (int j = 0; j < n_; ++j) {
      result.At(i, j) = At(j, i);
    }
  }

  return result;
}